

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<double> * Imath_3_2::Matrix44<double>::multiply(Matrix44<double> *a,Matrix44<double> *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double *in_RDX;
  double *in_RSI;
  Matrix44<double> *in_RDI;
  double c33;
  double c32;
  double c31;
  double c30;
  double a33;
  double a32;
  double a31;
  double a30;
  double c23;
  double c22;
  double c21;
  double c20;
  double a23;
  double a22;
  double a21;
  double a20;
  double c13;
  double c12;
  double c11;
  double c10;
  double a13;
  double a12;
  double a11;
  double a10;
  double c03;
  double c02;
  double c01;
  double c00;
  double a03;
  double a02;
  double a01;
  double a00;
  
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[3];
  dVar5 = in_RSI[4];
  dVar6 = in_RSI[5];
  dVar7 = in_RSI[6];
  dVar8 = in_RSI[7];
  dVar9 = in_RSI[8];
  dVar10 = in_RSI[9];
  dVar11 = in_RSI[10];
  dVar12 = in_RSI[0xb];
  dVar13 = in_RSI[0xc];
  dVar14 = in_RSI[0xd];
  dVar15 = in_RSI[0xe];
  dVar16 = in_RSI[0xf];
  Matrix44(in_RDI,dVar4 * in_RDX[0xc] + dVar3 * in_RDX[8] + dVar1 * *in_RDX + dVar2 * in_RDX[4],
           dVar4 * in_RDX[0xd] + dVar3 * in_RDX[9] + dVar1 * in_RDX[1] + dVar2 * in_RDX[5],
           dVar4 * in_RDX[0xe] + dVar3 * in_RDX[10] + dVar1 * in_RDX[2] + dVar2 * in_RDX[6],
           dVar4 * in_RDX[0xf] + dVar3 * in_RDX[0xb] + dVar1 * in_RDX[3] + dVar2 * in_RDX[7],
           dVar8 * in_RDX[0xc] + dVar7 * in_RDX[8] + dVar5 * *in_RDX + dVar6 * in_RDX[4],
           dVar8 * in_RDX[0xd] + dVar7 * in_RDX[9] + dVar5 * in_RDX[1] + dVar6 * in_RDX[5],
           dVar8 * in_RDX[0xe] + dVar7 * in_RDX[10] + dVar5 * in_RDX[2] + dVar6 * in_RDX[6],
           dVar8 * in_RDX[0xf] + dVar7 * in_RDX[0xb] + dVar5 * in_RDX[3] + dVar6 * in_RDX[7],
           dVar12 * in_RDX[0xc] + dVar11 * in_RDX[8] + dVar9 * *in_RDX + dVar10 * in_RDX[4],
           dVar12 * in_RDX[0xd] + dVar11 * in_RDX[9] + dVar9 * in_RDX[1] + dVar10 * in_RDX[5],
           dVar12 * in_RDX[0xe] + dVar11 * in_RDX[10] + dVar9 * in_RDX[2] + dVar10 * in_RDX[6],
           dVar12 * in_RDX[0xf] + dVar11 * in_RDX[0xb] + dVar9 * in_RDX[3] + dVar10 * in_RDX[7],
           dVar16 * in_RDX[0xc] + dVar15 * in_RDX[8] + dVar13 * *in_RDX + dVar14 * in_RDX[4],
           dVar16 * in_RDX[0xd] + dVar15 * in_RDX[9] + dVar13 * in_RDX[1] + dVar14 * in_RDX[5],
           dVar16 * in_RDX[0xe] + dVar15 * in_RDX[10] + dVar13 * in_RDX[2] + dVar14 * in_RDX[6],
           dVar16 * in_RDX[0xf] + dVar15 * in_RDX[0xb] + dVar13 * in_RDX[3] + dVar14 * in_RDX[7]);
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE inline IMATH_CONSTEXPR14 Matrix44<T>
Matrix44<T>::multiply (const Matrix44& a, const Matrix44& b) IMATH_NOEXCEPT
{
    const auto a00 = a.x[0][0];
    const auto a01 = a.x[0][1];
    const auto a02 = a.x[0][2];
    const auto a03 = a.x[0][3];

    const auto c00 =
        a00 * b.x[0][0] + a01 * b.x[1][0] + a02 * b.x[2][0] + a03 * b.x[3][0];
    const auto c01 =
        a00 * b.x[0][1] + a01 * b.x[1][1] + a02 * b.x[2][1] + a03 * b.x[3][1];
    const auto c02 =
        a00 * b.x[0][2] + a01 * b.x[1][2] + a02 * b.x[2][2] + a03 * b.x[3][2];
    const auto c03 =
        a00 * b.x[0][3] + a01 * b.x[1][3] + a02 * b.x[2][3] + a03 * b.x[3][3];

    const auto a10 = a.x[1][0];
    const auto a11 = a.x[1][1];
    const auto a12 = a.x[1][2];
    const auto a13 = a.x[1][3];

    const auto c10 =
        a10 * b.x[0][0] + a11 * b.x[1][0] + a12 * b.x[2][0] + a13 * b.x[3][0];
    const auto c11 =
        a10 * b.x[0][1] + a11 * b.x[1][1] + a12 * b.x[2][1] + a13 * b.x[3][1];
    const auto c12 =
        a10 * b.x[0][2] + a11 * b.x[1][2] + a12 * b.x[2][2] + a13 * b.x[3][2];
    const auto c13 =
        a10 * b.x[0][3] + a11 * b.x[1][3] + a12 * b.x[2][3] + a13 * b.x[3][3];

    const auto a20 = a.x[2][0];
    const auto a21 = a.x[2][1];
    const auto a22 = a.x[2][2];
    const auto a23 = a.x[2][3];

    const auto c20 =
        a20 * b.x[0][0] + a21 * b.x[1][0] + a22 * b.x[2][0] + a23 * b.x[3][0];
    const auto c21 =
        a20 * b.x[0][1] + a21 * b.x[1][1] + a22 * b.x[2][1] + a23 * b.x[3][1];
    const auto c22 =
        a20 * b.x[0][2] + a21 * b.x[1][2] + a22 * b.x[2][2] + a23 * b.x[3][2];
    const auto c23 =
        a20 * b.x[0][3] + a21 * b.x[1][3] + a22 * b.x[2][3] + a23 * b.x[3][3];

    const auto a30 = a.x[3][0];
    const auto a31 = a.x[3][1];
    const auto a32 = a.x[3][2];
    const auto a33 = a.x[3][3];

    const auto c30 =
        a30 * b.x[0][0] + a31 * b.x[1][0] + a32 * b.x[2][0] + a33 * b.x[3][0];
    const auto c31 =
        a30 * b.x[0][1] + a31 * b.x[1][1] + a32 * b.x[2][1] + a33 * b.x[3][1];
    const auto c32 =
        a30 * b.x[0][2] + a31 * b.x[1][2] + a32 * b.x[2][2] + a33 * b.x[3][2];
    const auto c33 =
        a30 * b.x[0][3] + a31 * b.x[1][3] + a32 * b.x[2][3] + a33 * b.x[3][3];
    return Matrix44 (
        c00,
        c01,
        c02,
        c03,
        c10,
        c11,
        c12,
        c13,
        c20,
        c21,
        c22,
        c23,
        c30,
        c31,
        c32,
        c33);
}